

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CounterUnitTest.cpp
# Opt level: O2

bool TestCompressionF<Counter<unsigned_short,16u>,Counter<unsigned_char,8u>>(int bias)

{
  ushort uVar1;
  ushort uVar2;
  ushort uVar3;
  uint original;
  uint uVar4;
  uint recent;
  uint uVar5;
  ushort uVar6;
  int delta;
  ushort uVar7;
  
  for (uVar4 = 0; uVar4 != 0x200; uVar4 = uVar4 + 1) {
    uVar3 = (ushort)uVar4;
    uVar1 = uVar3 & 0xff;
    for (uVar5 = 0; uVar5 != 0x200; uVar5 = uVar5 + 1) {
      if (uVar5 < uVar4) {
        if ((int)(uVar4 - uVar5) < 0x80 - bias) {
LAB_00101f03:
          uVar2 = (ushort)uVar5;
          uVar6 = uVar2 & 0x100 | uVar1;
          uVar7 = uVar2 & 0xff;
          if (uVar7 < uVar1) {
            if ((ushort)(0x80 - bias) <= (ushort)(uVar1 - uVar7)) {
              uVar6 = uVar6 - 0x100;
            }
          }
          else if ((ushort)(bias + 0x80) < (ushort)(uVar7 - uVar1)) {
            uVar6 = uVar6 + 0x100;
          }
          if ((uVar6 != uVar3) ||
             ((bias == 0 && ((ushort)((short)(char)((char)uVar4 - (char)uVar5) + uVar2) != uVar3))))
          goto LAB_00101f76;
        }
      }
      else if ((int)(uVar5 - uVar4) <= bias + 0x80) goto LAB_00101f03;
    }
  }
LAB_00101f76:
  return 0x1ff < uVar4;
}

Assistant:

bool TestCompressionF(int bias)
{
    const unsigned range = SmallerT::kMSB << 2;

    for (unsigned original = 0; original < range; ++original)
    {
        LargerT fullOriginal = original;
        SmallerT truncatedOriginal;
        fullOriginal.TruncateTo(truncatedOriginal);

        for (unsigned recent = 0; recent < range; ++recent)
        {
            LargerT fullRecent = recent;
            SmallerT truncatedRecent;
            fullRecent.TruncateTo(truncatedRecent);

            // Skip cases we cannot handle
            if (recent < original)
            {
                int delta = original - recent;
                if (delta >= SmallerT::kMSB - bias)
                    continue;
            }
            else
            {
                int delta = recent - original;
                if (delta > SmallerT::kMSB + bias)
                    continue;
            }

#if 0
            // Useful for debugging
            int changeNeeded = (int)((fullOriginal.Get() >> Counter4::kBits) - (fullRecent.Get() >> Counter4::kBits));
            if (changeNeeded != 0)
            {
                std::cout << "orig=" << (int)fullOriginal.Get();
                std::cout << ", recent=" << (int)fullRecent.Get();
                std::cout << ", (T)orig=" << (int)truncatedOriginal.Get();
                std::cout << ", (T)recent=" << (int)truncatedRecent.Get();
                std::cout << ", delta=" << (int)(truncatedRecent.Get() - truncatedOriginal.Get());
                std::cout << ", Expected=" << changeNeeded;
                std::cout << std::endl;
            }
#endif

            LargerT expanded = LargerT::ExpandFromTruncatedWithBias(fullRecent, truncatedOriginal, bias);
            TEST_CHECK(expanded.ToUnsigned() == fullOriginal.ToUnsigned());

            if (bias == 0)
            {
                expanded = LargerT::ExpandFromTruncated(fullRecent, truncatedOriginal);
                TEST_CHECK(expanded.ToUnsigned() == fullOriginal.ToUnsigned());
            }
        }
    }

    return true;
}